

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_delete(char *_fname)

{
  void *pvVar1;
  _func_int_void_ptr_char_ptr *p_Var2;
  DirHandle *pDVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  long *plVar8;
  long lVar9;
  void **retval;
  long **pplVar10;
  PHYSFS_ErrorCode errcode;
  long *local_28;
  
  pplVar10 = &local_28;
  if (_fname == (char *)0x0) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
LAB_0010873b:
    PHYSFS_setErrorCode(errcode);
    iVar5 = 0;
  }
  else {
    sVar7 = strlen(_fname);
    if (sVar7 + 1 < 0x100) {
      plVar8 = (long *)((long)&local_28 - (sVar7 + 0x18 & 0xfffffffffffffff0));
      lVar9 = 0;
      pplVar10 = (long **)plVar8;
    }
    else {
      plVar8 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar7 + 9);
      if (plVar8 == (long *)0x0) {
        errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        goto LAB_0010873b;
      }
      lVar9 = 1;
    }
    *plVar8 = lVar9;
    local_28 = plVar8 + 1;
    ((long *)pplVar10)[-1] = 0x1086c3;
    iVar5 = sanitizePlatformIndependentPath(_fname,(char *)(plVar8 + 1));
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else {
      ((long *)pplVar10)[-1] = 0x1086d3;
      __PHYSFS_platformGrabMutex(stateLock);
      pDVar3 = writeDir;
      if (writeDir == (DirHandle *)0x0) {
        ((long *)pplVar10)[-1] = 0x108716;
        PHYSFS_setErrorCode(PHYSFS_ERR_NO_WRITE_DIR);
        iVar5 = 0;
      }
      else {
        iVar5 = 0;
        ((long *)pplVar10)[-1] = 0x1086f0;
        iVar6 = verifyPath(writeDir,(char **)&local_28,0);
        plVar4 = local_28;
        if (iVar6 != 0) {
          pvVar1 = pDVar3->opaque;
          p_Var2 = pDVar3->funcs->remove;
          ((long *)pplVar10)[-1] = 0x108702;
          iVar5 = (*p_Var2)(pvVar1,(char *)plVar4);
        }
      }
      ((long *)pplVar10)[-1] = 0x108725;
      __PHYSFS_platformReleaseMutex(stateLock);
    }
    if (*plVar8 != 0) {
      ((long *)pplVar10)[-1] = 0x108734;
      (*__PHYSFS_AllocatorHooks.Free)(plVar8);
    }
  }
  return iVar5;
}

Assistant:

int PHYSFS_delete(const char *_fname)
{
    int retval;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    retval = doDelete(_fname, fname);
    __PHYSFS_smallFree(fname);
    return retval;
}